

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prometheus.cc
# Opt level: O1

string * __thiscall
instrumentation::(anonymous_namespace)::prom_collector::quote_string_abi_cxx11_
          (string *__return_storage_ptr__,prom_collector *this,string_view s)

{
  prom_collector pVar1;
  prom_collector *ppVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  if (this != (prom_collector *)0x0) {
    ppVar2 = (prom_collector *)0x0;
    do {
      pVar1 = ppVar2[s._M_len];
      if (((pVar1 == (prom_collector)0xa) || (pVar1 == (prom_collector)0x22)) ||
         (pVar1 == (prom_collector)0x5c)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      ppVar2 = ppVar2 + 1;
    } while (this != ppVar2);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  return __return_storage_ptr__;
}

Assistant:

static auto quote_string(std::string_view s) -> std::string {
    std::string out;
    out.reserve(s.size() + 2u);

    out.append(1, '"');

    for (char c : s) {
      switch (c) {
      default:
        out.push_back(c);
        break;
      case '\n':
        out.append(R"(\n)");
        break;
      case '\\':
        out.append(R"(\\)");
        break;
      case '"':
        out.append(R"(\")");
        break;
      }
    }

    out.append(1, '"');
    return out;
  }